

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_traits.h
# Opt level: O1

StatusOr<int>
google::protobuf::json_internal::Proto3Type::EnumNumberByName
          (Field f,string_view name,bool case_insensitive)

{
  int iVar1;
  void *pvVar2;
  Message *__n;
  char cVar3;
  int iVar4;
  Rep *pRVar5;
  undefined8 *puVar6;
  undefined7 in_register_00000009;
  undefined8 extraout_RDX;
  char in_R8B;
  RepeatedPtrFieldBase *pRVar7;
  RepeatedPtrFieldBase *this;
  StatusOr<int> SVar8;
  Status _status;
  StatusOr<const_google::protobuf::json_internal::ResolverPool::Enum_*> e;
  Status local_80;
  Status local_78;
  undefined8 local_70;
  long local_68 [2];
  HeapOrSoo local_58;
  Message *local_48;
  void *local_40;
  Message **local_38;
  code *local_30;
  
  local_40 = (void *)CONCAT71(in_register_00000009,case_insensitive);
  local_48 = (Message *)name._M_str;
  ResolverPool::Field::EnumType((Field *)&local_58.heap);
  local_78.rep_ = (uintptr_t)local_58.heap.control;
  if (((ulong)local_58.heap.control & 1) == 0) {
    LOCK();
    *(undefined4 *)local_58.heap.control = *(undefined4 *)local_58.heap.control + ~kDeleted;
    UNLOCK();
  }
  if (local_58.heap.control == (ctrl_t *)0x1) {
    this = (RepeatedPtrFieldBase *)((long)local_58.heap.slot_array + 0x20);
    pRVar7 = this;
    if ((*(byte *)((long)local_58.heap.slot_array + 0x20) & 1) != 0) {
      pRVar5 = internal::RepeatedPtrFieldBase::rep(this);
      pRVar7 = (RepeatedPtrFieldBase *)pRVar5->elements;
    }
    if (((ulong)this->tagged_rep_or_elem_ & 1) != 0) {
      pRVar5 = internal::RepeatedPtrFieldBase::rep(this);
      this = (RepeatedPtrFieldBase *)pRVar5->elements;
    }
    iVar1 = *(int *)((long)local_58.heap.slot_array + 0x28);
    for (; pRVar7 != (RepeatedPtrFieldBase *)(&this->tagged_rep_or_elem_ + iVar1);
        pRVar7 = (RepeatedPtrFieldBase *)&pRVar7->current_size_) {
      pvVar2 = pRVar7->tagged_rep_or_elem_;
      puVar6 = (undefined8 *)(*(ulong *)((long)pvVar2 + 0x28) & 0xfffffffffffffffc);
      __n = (Message *)puVar6[1];
      if (in_R8B == '\0') {
        if ((__n == local_48) &&
           ((__n == (Message *)0x0 ||
            (iVar4 = bcmp((void *)*puVar6,local_40,(size_t)__n), iVar4 == 0)))) goto LAB_002d1fae;
      }
      else {
        cVar3 = absl::lts_20240722::EqualsIgnoreCase(__n);
        if (cVar3 != '\0') {
LAB_002d1fae:
          *(undefined4 *)&f->raw_ = *(undefined4 *)((long)pvVar2 + 0x30);
          f->pool_ = (ResolverPool *)0x1;
          goto LAB_002d1fbd;
        }
      }
    }
    local_38 = &local_48;
    local_30 = absl::lts_20240722::str_format_internal::FormatArgImpl::
               Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
    absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
              (&local_78,"unknown enum value: \'%s\'",0x18,&local_38,1);
    absl::lts_20240722::InvalidArgumentError(&local_80,local_70,local_78.rep_);
    absl::lts_20240722::internal_statusor::StatusOrData<int>::
    StatusOrData<absl::lts_20240722::Status,_0>((StatusOrData<int> *)f,&local_80);
    if ((local_80.rep_ & 1) == 0) {
      absl::lts_20240722::status_internal::StatusRep::Unref();
    }
    if ((long *)local_78.rep_ != local_68) {
      operator_delete((void *)local_78.rep_,local_68[0] + 1);
    }
  }
  else {
    absl::lts_20240722::internal_statusor::StatusOrData<int>::
    StatusOrData<const_absl::lts_20240722::Status,_0>((StatusOrData<int> *)f,&local_78);
    absl::lts_20240722::Status::~Status(&local_78);
  }
LAB_002d1fbd:
  absl::lts_20240722::internal_statusor::
  StatusOrData<const_google::protobuf::json_internal::ResolverPool::Enum_*>::~StatusOrData
            ((StatusOrData<const_google::protobuf::json_internal::ResolverPool::Enum_*> *)
             &local_58.heap);
  SVar8.super_StatusOrData<int>._8_8_ = extraout_RDX;
  SVar8.super_StatusOrData<int>.field_0 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)f;
  return (StatusOr<int>)SVar8.super_StatusOrData<int>;
}

Assistant:

static absl::StatusOr<int32_t> EnumNumberByName(Field f,
                                                  absl::string_view name,
                                                  bool case_insensitive) {
    auto e = f->EnumType();
    RETURN_IF_ERROR(e.status());

    for (const auto& ev : (**e).proto().enumvalue()) {
      if (case_insensitive) {
        // Two ifs to avoid doing operator== twice if the names are not equal.
        if (absl::EqualsIgnoreCase(ev.name(), name)) {
          return ev.number();
        }
      } else if (ev.name() == name) {
        return ev.number();
      }
    }
    return absl::InvalidArgumentError(
        absl::StrFormat("unknown enum value: '%s'", name));
  }